

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O1

void __thiscall
OpenMesh::PolyConnectivity::delete_face
          (PolyConnectivity *this,FaceHandle _fh,bool _delete_isolated_vertices)

{
  HalfedgeHandle HVar1;
  HalfedgeHandle _heh;
  VertexHandle _vh;
  HalfedgeHandle _nheh;
  HalfedgeHandle _heh_00;
  BaseHandle BVar2;
  pointer pVVar3;
  HalfedgeHandle _hh;
  reference pvVar4;
  Face *pFVar5;
  Halfedge *pHVar6;
  Vertex *pVVar7;
  undefined7 in_register_00000011;
  undefined1 auVar8 [8];
  undefined1 auVar9 [8];
  undefined1 local_b0 [8];
  FaceHalfedgeIter fh_it;
  undefined1 auStack_88 [8];
  vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_> deleted_edges;
  undefined1 auStack_68 [8];
  vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> vhandles;
  BaseHandle local_44;
  BaseHandle local_40;
  undefined4 local_3c;
  BaseHandle local_38;
  BaseHandle local_34;
  
  local_3c = (undefined4)CONCAT71(in_register_00000011,_delete_isolated_vertices);
  if ((_fh.super_BaseHandle.idx_ != -1) &&
     (pvVar4 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                         ((BaseKernel *)this,
                          (FPropHandleT<OpenMesh::Attributes::StatusInfo>)
                          (this->super_ArrayKernel).face_status_.
                          super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.
                          idx_,(FaceHandle)_fh.super_BaseHandle.idx_), (pvVar4->status_ & 1) == 0))
  {
    pvVar4 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                       ((BaseKernel *)this,
                        (FPropHandleT<OpenMesh::Attributes::StatusInfo>)
                        (this->super_ArrayKernel).face_status_.
                        super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.
                        idx_,(FaceHandle)_fh.super_BaseHandle.idx_);
    *(byte *)&pvVar4->status_ = (byte)pvVar4->status_ | 1;
    auStack_88 = (undefined1  [8])0x0;
    deleted_edges.super__Vector_base<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    deleted_edges.super__Vector_base<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>::reserve
              ((vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_> *)auStack_88,3);
    auStack_68 = (undefined1  [8])0x0;
    vhandles.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vhandles.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::reserve
              ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)auStack_68
               ,3);
    pFVar5 = ArrayKernel::face(&this->super_ArrayKernel,_fh);
    fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ =
         (pFVar5->halfedge_handle_).super_BaseHandle.idx_;
    fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.idx_ =
         (BaseHandle)0x0;
    fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_ =
         (BaseHandle)0xffffffff;
    local_b0 = (undefined1  [8])this;
    fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ =
         fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_;
    while ((HVar1.super_BaseHandle.idx_ =
                 (BaseHandle)
                 (BaseHandle)
                 fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_,
           fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1 &&
           ((fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ !=
             fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ ||
            (fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
             idx_ == 0))))) {
      if (fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ == -1) {
        __assert_fail("this->heh_.is_valid()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/Mesh/CirculatorsT.hh"
                      ,0x115,
                      "value_type OpenMesh::Iterators::GenericCirculatorT<OpenMesh::PolyConnectivity, OpenMesh::FaceHandle, OpenMesh::HalfedgeHandle, &OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>::operator*() const [Mesh = OpenMesh::PolyConnectivity, CenterEntityHandle = OpenMesh::FaceHandle, ValueHandle = OpenMesh::HalfedgeHandle, Handle2Value = &OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle]"
                     );
      }
      pHVar6 = ArrayKernel::halfedge
                         (&this->super_ArrayKernel,
                          (HalfedgeHandle)
                          fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_
                         );
      (pHVar6->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ = -1;
      pHVar6 = ArrayKernel::halfedge
                         (&this->super_ArrayKernel,
                          (HalfedgeHandle)
                          ((-((uint)HVar1.super_BaseHandle.idx_ & 1) | 1) +
                          (int)HVar1.super_BaseHandle.idx_));
      if ((pHVar6->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ == -1) {
        local_44.idx_ = (int)HVar1.super_BaseHandle.idx_ >> 1;
        if (deleted_edges.
            super__Vector_base<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>._M_impl.
            super__Vector_impl_data._M_start ==
            deleted_edges.
            super__Vector_base<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>::
          _M_realloc_insert<OpenMesh::EdgeHandle>
                    ((vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_> *)
                     auStack_88,
                     (iterator)
                     deleted_edges.
                     super__Vector_base<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>
                     ._M_impl.super__Vector_impl_data._M_start,(EdgeHandle *)&local_44);
        }
        else {
          ((deleted_edges.
            super__Vector_base<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>._M_impl.
            super__Vector_impl_data._M_start)->super_BaseHandle).idx_ = local_44.idx_;
          deleted_edges.
          super__Vector_base<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>._M_impl.
          super__Vector_impl_data._M_start =
               deleted_edges.
               super__Vector_base<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>.
               _M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      pHVar6 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar1);
      local_44.idx_ = (pHVar6->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
      if (vhandles.
          super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          vhandles.
          super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
        _M_realloc_insert<OpenMesh::VertexHandle>
                  ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                   auStack_68,
                   (iterator)
                   vhandles.
                   super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                   ._M_impl.super__Vector_impl_data._M_start,(VertexHandle *)&local_44);
      }
      else {
        ((vhandles.
          super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
          _M_impl.super__Vector_impl_data._M_start)->super_BaseHandle).idx_ = local_44.idx_;
        vhandles.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
        ._M_impl.super__Vector_impl_data._M_start =
             vhandles.
             super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                    *)local_b0);
    }
    fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_ =
         deleted_edges.
         super__Vector_base<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>._M_impl.
         super__Vector_impl_data._M_start;
    auVar8 = auStack_88;
    auVar9 = auStack_68;
    pVVar3 = vhandles.
             super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (auStack_88 !=
        (undefined1  [8])
        deleted_edges.
        super__Vector_base<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>._M_impl.
        super__Vector_impl_data._M_start) {
      do {
        HVar1.super_BaseHandle.idx_ = (BaseHandle)((((pointer)auVar8)->super_BaseHandle).idx_ * 2);
        pHVar6 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar1);
        local_34.idx_ = (pHVar6->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
        pHVar6 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar1);
        local_38.idx_ =
             (pHVar6->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_;
        vhandles.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (int)HVar1.super_BaseHandle.idx_;
        pHVar6 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar1);
        _heh.super_BaseHandle.idx_ =
             (BaseHandle)(pHVar6->prev_halfedge_handle_).super_BaseHandle.idx_;
        HVar1.super_BaseHandle.idx_ =
             (BaseHandle)((((pointer)auVar8)->super_BaseHandle).idx_ * 2 + 1);
        pHVar6 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar1);
        _vh.super_BaseHandle.idx_ =
             (BaseHandle)(pHVar6->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
        pHVar6 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar1);
        _nheh.super_BaseHandle.idx_ =
             (BaseHandle)
             (pHVar6->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_;
        pHVar6 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar1);
        _heh_00.super_BaseHandle.idx_ =
             (BaseHandle)(pHVar6->prev_halfedge_handle_).super_BaseHandle.idx_;
        local_40.idx_ = (int)_nheh.super_BaseHandle.idx_;
        ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh,_nheh);
        _hh.super_BaseHandle.idx_ =
             (BaseHandle)
             (BaseHandle)
             vhandles.
             super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        ArrayKernel::set_next_halfedge_handle
                  (&this->super_ArrayKernel,_heh_00,(HalfedgeHandle)local_38.idx_);
        BVar2.idx_ = (this->super_ArrayKernel).edge_status_.
                     super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_;
        if ((BaseHandle)BVar2.idx_ != (BaseHandle)0xffffffff) {
          pvVar4 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                             ((BaseKernel *)this,
                              (EPropHandleT<OpenMesh::Attributes::StatusInfo>)BVar2.idx_,
                              (EdgeHandle)(((pointer)auVar8)->super_BaseHandle).idx_);
          *(byte *)&pvVar4->status_ = (byte)pvVar4->status_ | 1;
        }
        BVar2.idx_ = (this->super_ArrayKernel).halfedge_status_.
                     super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_;
        if ((BaseHandle)BVar2.idx_ != (BaseHandle)0xffffffff) {
          pvVar4 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                             ((BaseKernel *)this,
                              (HPropHandleT<OpenMesh::Attributes::StatusInfo>)BVar2.idx_,_hh);
          *(byte *)&pvVar4->status_ = (byte)pvVar4->status_ | 1;
          pvVar4 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                             ((BaseKernel *)this,
                              (HPropHandleT<OpenMesh::Attributes::StatusInfo>)
                              (this->super_ArrayKernel).halfedge_status_.
                              super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
                              super_BaseHandle.idx_,(HalfedgeHandle)HVar1.super_BaseHandle.idx_);
          *(byte *)&pvVar4->status_ = (byte)pvVar4->status_ | 1;
        }
        pVVar7 = ArrayKernel::vertex(&this->super_ArrayKernel,(VertexHandle)local_34.idx_);
        if ((BaseHandle)(pVVar7->halfedge_handle_).super_BaseHandle.idx_ ==
            HVar1.super_BaseHandle.idx_) {
          if ((BaseHandle)local_38.idx_ == HVar1.super_BaseHandle.idx_) {
            if ((char)local_3c != '\0') {
              pvVar4 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                                 ((BaseKernel *)this,
                                  (VPropHandleT<OpenMesh::Attributes::StatusInfo>)
                                  (this->super_ArrayKernel).vertex_status_.
                                  super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
                                  super_BaseHandle.idx_,(VertexHandle)local_34.idx_);
              *(byte *)&pvVar4->status_ = (byte)pvVar4->status_ | 1;
            }
            pVVar7 = ArrayKernel::vertex(&this->super_ArrayKernel,(VertexHandle)local_34.idx_);
            (pVVar7->halfedge_handle_).super_BaseHandle.idx_ = -1;
          }
          else {
            pVVar7 = ArrayKernel::vertex(&this->super_ArrayKernel,(VertexHandle)local_34.idx_);
            (pVVar7->halfedge_handle_).super_BaseHandle.idx_ = local_38.idx_;
          }
        }
        pVVar7 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
        if ((BaseHandle)(pVVar7->halfedge_handle_).super_BaseHandle.idx_ ==
            _hh.super_BaseHandle.idx_) {
          if ((BaseHandle)local_40.idx_ == _hh.super_BaseHandle.idx_) {
            if ((char)local_3c != '\0') {
              pvVar4 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                                 ((BaseKernel *)this,
                                  (VPropHandleT<OpenMesh::Attributes::StatusInfo>)
                                  (this->super_ArrayKernel).vertex_status_.
                                  super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
                                  super_BaseHandle.idx_,(VertexHandle)_vh.super_BaseHandle.idx_);
              *(byte *)&pvVar4->status_ = (byte)pvVar4->status_ | 1;
            }
            pVVar7 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
            (pVVar7->halfedge_handle_).super_BaseHandle.idx_ = -1;
          }
          else {
            pVVar7 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
            (pVVar7->halfedge_handle_).super_BaseHandle.idx_ = local_40.idx_;
          }
        }
        auVar8 = (undefined1  [8])((long)auVar8 + 4);
        auVar9 = auStack_68;
        pVVar3 = vhandles.
                 super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (auVar8 != (undefined1  [8])
                         fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_);
    }
    for (; auVar9 != (undefined1  [8])pVVar3; auVar9 = (undefined1  [8])((long)auVar9 + 4)) {
      adjust_outgoing_halfedge(this,(VertexHandle)(((pointer)auVar9)->super_BaseHandle).idx_);
    }
    if (auStack_68 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_68);
    }
    if (auStack_88 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_88);
    }
    return;
  }
  __assert_fail("_fh.is_valid() && !status(_fh).deleted()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                ,0x1f8,"void OpenMesh::PolyConnectivity::delete_face(FaceHandle, bool)");
}

Assistant:

void PolyConnectivity::delete_face(FaceHandle _fh, bool _delete_isolated_vertices)
{
  assert(_fh.is_valid() && !status(_fh).deleted());

  // mark face deleted
  status(_fh).set_deleted(true);


  // this vector will hold all boundary edges of face _fh
  // these edges will be deleted
  std::vector<EdgeHandle> deleted_edges;
  deleted_edges.reserve(3);


  // this vector will hold all vertices of face _fh
  // for updating their outgoing halfedge
  std::vector<VertexHandle>  vhandles;
  vhandles.reserve(3);


  // for all halfedges of face _fh do:
  //   1) invalidate face handle.
  //   2) collect all boundary halfedges, set them deleted
  //   3) store vertex handles
  HalfedgeHandle hh;
  for (FaceHalfedgeIter fh_it(fh_iter(_fh)); fh_it.is_valid(); ++fh_it)
  {
    hh = *fh_it;

    set_boundary(hh);//set_face_handle(hh, InvalidFaceHandle);

    if (is_boundary(opposite_halfedge_handle(hh)))
        deleted_edges.push_back(edge_handle(hh));

    vhandles.push_back(to_vertex_handle(hh));
  }


  // delete all collected (half)edges
  // these edges were all boundary
  // delete isolated vertices (if _delete_isolated_vertices is true)
  if (!deleted_edges.empty())
  {
    std::vector<EdgeHandle>::iterator del_it(deleted_edges.begin()),
                                      del_end(deleted_edges.end());
    HalfedgeHandle h0, h1, next0, next1, prev0, prev1;
    VertexHandle   v0, v1;

    for (; del_it!=del_end; ++del_it)
    {
      h0    = halfedge_handle(*del_it, 0);
      v0    = to_vertex_handle(h0);
      next0 = next_halfedge_handle(h0);
      prev0 = prev_halfedge_handle(h0);

      h1    = halfedge_handle(*del_it, 1);
      v1    = to_vertex_handle(h1);
      next1 = next_halfedge_handle(h1);
      prev1 = prev_halfedge_handle(h1);

      // adjust next and prev handles
      set_next_halfedge_handle(prev0, next1);
      set_next_halfedge_handle(prev1, next0);

      // mark edge deleted if the mesh has a edge status
      if ( has_edge_status() )
    	 status(*del_it).set_deleted(true);


      // mark corresponding halfedges as deleted
      // As the deleted edge is boundary,
      // all corresponding halfedges will also be deleted.
      if ( has_halfedge_status() ) {
        status(h0).set_deleted(true);
        status(h1).set_deleted(true);
      }

      // update v0
      if (halfedge_handle(v0) == h1)
      {
        // isolated ?
        if (next0 == h1)
        {
          if (_delete_isolated_vertices)
            status(v0).set_deleted(true);
          set_isolated(v0);
        }
        else set_halfedge_handle(v0, next0);
      }

      // update v1
      if (halfedge_handle(v1) == h0)
      {
        // isolated ?
        if (next1 == h0)
        {
          if (_delete_isolated_vertices)
            status(v1).set_deleted(true);
          set_isolated(v1);
        }
        else  set_halfedge_handle(v1, next1);
      }
    }
  }

  // update outgoing halfedge handles of remaining vertices
  std::vector<VertexHandle>::iterator v_it(vhandles.begin()),
                                      v_end(vhandles.end());
  for (; v_it!=v_end; ++v_it)
    adjust_outgoing_halfedge(*v_it);
}